

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateLengthDelim
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field)

{
  _func_void_FieldDescriptor_ptr *p_Var1;
  long lVar2;
  FieldDescriptor FVar3;
  bool bVar4;
  Descriptor *pDVar5;
  FieldDescriptor *this_00;
  LogMessage *pLVar6;
  EnumDescriptor *pEVar7;
  Options *in_RCX;
  Options *pOVar8;
  char *pcVar9;
  string enum_type;
  FieldDescriptor *local_80;
  undefined1 local_78 [56];
  FieldDescriptor *local_40;
  char *local_38;
  
  if ((~(byte)field[1] & 0x60) == 0) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_78._0_8_ = FieldDescriptor::TypeOnceInit;
      local_80 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_78,&local_80
                );
    }
    FVar3 = field[2];
    in_RCX = (Options *)(ulong)((byte)FVar3 - 0xd);
    if (0xfffffffb < (byte)FVar3 - 0xd) goto LAB_002b6002;
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_78._0_8_ = FieldDescriptor::TypeOnceInit;
      local_80 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_78,&local_80
                );
      FVar3 = field[2];
    }
    if ((FVar3 != (FieldDescriptor)0xe) ||
       (pOVar8 = *(Options **)(field + 0x10),
       *(char *)((long)&(pOVar8->runtime_include_base)._M_dataplus._M_p + 2) == '\x03')) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_78._0_8_ = FieldDescriptor::TypeOnceInit;
        local_80 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_78,
                   &local_80);
        FVar3 = field[2];
      }
      local_78._0_8_ = DeclaredTypeMethodName((uint)(byte)FVar3);
      Formatter::operator()
                (format,
                 "ptr = ::$proto_ns$::internal::Packed$1$Parser($msg$_internal_mutable_$name$(), ptr, ctx);\n"
                 ,(char **)local_78);
      return;
    }
    pEVar7 = FieldDescriptor::enum_type(field);
    QualifiedClassName_abi_cxx11_
              ((string *)local_78,(cpp *)pEVar7,(EnumDescriptor *)this->options_,pOVar8);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_80 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_40 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_80,
                 &local_40);
    }
    local_38 = DeclaredTypeMethodName((uint)(byte)field[2]);
    local_80 = (FieldDescriptor *)CONCAT44(local_80._4_4_,*(undefined4 *)(field + 4));
    Formatter::operator()
              (format,
               "ptr = ::$proto_ns$::internal::Packed$1$Parser<$unknown_fields_type$>($msg$_internal_mutable_$name$(), ptr, ctx, $2$_IsValid, &$msg$_internal_metadata_, $3$);\n"
               ,&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               (int *)&local_80);
  }
  else {
LAB_002b6002:
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_78._0_8_ = FieldDescriptor::TypeOnceInit;
      local_80 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_78,&local_80
                );
    }
    FVar3 = field[2];
    if (FVar3 == (FieldDescriptor)0xc) {
      bVar4 = false;
LAB_002b617d:
      GenerateStrings(this,format,field,bVar4);
      return;
    }
    if (FVar3 != (FieldDescriptor)0xb) {
      if (FVar3 != (FieldDescriptor)0x9) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                   ,0x339);
        pLVar6 = internal::LogMessage::operator<<
                           ((LogMessage *)local_78,
                            "Illegal combination for length delimited wiretype ");
        pLVar6 = internal::LogMessage::operator<<(pLVar6," filed type is ");
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_80 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
          local_40 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_80,
                     &local_40);
        }
        pLVar6 = internal::LogMessage::operator<<(pLVar6,(uint)(byte)field[2]);
        internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar6);
        internal::LogMessage::~LogMessage((LogMessage *)local_78);
        return;
      }
      bVar4 = true;
      goto LAB_002b617d;
    }
    if (*(once_flag **)(field + 0x18) == (once_flag *)0x0) {
LAB_002b6086:
      bVar4 = FieldDescriptor::is_map_message_type(field);
      if (bVar4) {
        pDVar5 = FieldDescriptor::message_type(field);
        p_Var1 = (_func_void_FieldDescriptor_ptr *)(local_78 + 0x10);
        local_78._0_8_ = p_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"value","");
        this_00 = Descriptor::FindFieldByName(pDVar5,(ConstStringParam)local_78);
        if ((_func_void_FieldDescriptor_ptr *)local_78._0_8_ != p_Var1) {
          operator_delete((void *)local_78._0_8_);
        }
        if (this_00 == (FieldDescriptor *)0x0) {
          in_RCX = (Options *)0x2f4;
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                     ,0x2f4);
          pLVar6 = internal::LogMessage::operator<<((LogMessage *)local_78,"CHECK failed: val: ");
          internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)local_78);
        }
        if (*(once_flag **)(this_00 + 0x18) != (once_flag *)0x0) {
          local_78._0_8_ = FieldDescriptor::TypeOnceInit;
          local_80 = this_00;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(this_00 + 0x18),(_func_void_FieldDescriptor_ptr **)local_78,
                     &local_80);
        }
        if ((this_00[2] != (FieldDescriptor)0xe) ||
           (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03')) {
          pcVar9 = "ptr = ctx->ParseMessage(&$msg$$name$_, ptr);\n";
          goto LAB_002b6443;
        }
        pEVar7 = FieldDescriptor::enum_type(this_00);
        QualifiedClassName_abi_cxx11_
                  ((string *)local_78,(cpp *)pEVar7,(EnumDescriptor *)this->options_,in_RCX);
        local_80 = (FieldDescriptor *)CONCAT44(local_80._4_4_,*(undefined4 *)(field + 4));
        Formatter::operator()
                  (format,
                   "auto object = ::$proto_ns$::internal::InitEnumParseWrapper<$unknown_fields_type$>(&$msg$$name$_, $1$_IsValid, $2$, &$msg$_internal_metadata_);\nptr = ctx->ParseMessage(&object, ptr);\n"
                   ,(string *)local_78,(int *)&local_80);
        if ((_func_void_FieldDescriptor_ptr *)local_78._0_8_ == p_Var1) {
          return;
        }
        goto LAB_002b63e7;
      }
    }
    else {
      local_78._0_8_ = FieldDescriptor::TypeOnceInit;
      local_80 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_78,&local_80
                );
      if (field[2] == (FieldDescriptor)0xb) goto LAB_002b6086;
    }
    bVar4 = IsLazy(field,this->options_,this->scc_analyzer_);
    if (bVar4) {
      bVar4 = ((byte)field[1] & 0x10) == 0;
      pOVar8 = (Options *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar4);
      lVar2 = *(long *)(field + 0x28);
      if ((lVar2 == 0 || bVar4) ||
         ((*(int *)(lVar2 + 4) == 1 &&
          (pOVar8 = *(Options **)(lVar2 + 0x20),
          ((ulong)(pOVar8->dllexport_decl)._M_dataplus._M_p & 0x200) != 0)))) {
        bVar4 = HasHasbit(field);
        if (bVar4) {
          pcVar9 = "_Internal::set_has_$name$(&$has_bits$);\nauto* lazy_field = &$msg$$name$_;\n";
        }
        else {
          pcVar9 = "auto* lazy_field = &$msg$$name$_;\n";
        }
        Formatter::operator()<>(format,pcVar9);
      }
      else {
        Formatter::operator()
                  (format,
                   "if (!$msg$_internal_has_$name$()) {\n  $msg$clear_$1$();\n  $msg$$1$_.$name$_ = ::$proto_ns$::Arena::CreateMessage<\n      ::$proto_ns$::internal::LazyField>($msg$GetArenaForAllocation());\n  $msg$set_has_$name$();\n}\nauto* lazy_field = $msg$$1$_.$name$_;\n"
                   ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     (lVar2 + 8));
      }
      FieldMessageTypeName_abi_cxx11_
                ((string *)local_78,(cpp *)field,(FieldDescriptor *)this->options_,pOVar8);
      Formatter::operator()
                (format,
                 "::$proto_ns$::internal::LazyFieldParseHelper<\n  ::$proto_ns$::internal::LazyField> parse_helper(\n    $1$::default_instance(),\n    $msg$GetArenaForAllocation(), lazy_field);\nptr = ctx->ParseMessage(&parse_helper, ptr);\n"
                 ,(string *)local_78);
    }
    else {
      bVar4 = IsImplicitWeakField(field,this->options_,this->scc_analyzer_);
      if (bVar4) {
        if ((~(byte)field[1] & 0x60) != 0) {
          pcVar9 = "ptr = ctx->ParseMessage(_Internal::mutable_$name$($this$), ptr);\n";
LAB_002b6443:
          Formatter::operator()<>(format,pcVar9);
          return;
        }
        pDVar5 = FieldDescriptor::message_type(field);
        QualifiedDefaultInstanceName_abi_cxx11_
                  ((string *)local_78,(cpp *)pDVar5,(Descriptor *)this->options_,in_RCX);
        Formatter::operator()
                  (format,
                   "ptr = ctx->ParseMessage($msg$$name$_.AddWeak(reinterpret_cast<const ::$proto_ns$::MessageLite*>($1$ptr_)), ptr);\n"
                   ,(string *)local_78);
      }
      else {
        bVar4 = IsWeak(field,this->options_);
        if (!bVar4) {
          pcVar9 = "ptr = ctx->ParseMessage($msg$_internal_$mutable_field$(), ptr);\n";
          goto LAB_002b6443;
        }
        pDVar5 = FieldDescriptor::message_type(field);
        QualifiedDefaultInstanceName_abi_cxx11_
                  ((string *)local_78,(cpp *)pDVar5,(Descriptor *)this->options_,in_RCX);
        local_80 = (FieldDescriptor *)CONCAT44(local_80._4_4_,*(undefined4 *)(field + 4));
        Formatter::operator()
                  (format,
                   "{\n  auto* default_ = &reinterpret_cast<const Message&>($1$);\n  ptr = ctx->ParseMessage($msg$_weak_field_map_.MutableMessage($2$, default_), ptr);\n}\n"
                   ,(string *)local_78,(int *)&local_80);
      }
    }
  }
  if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) {
    return;
  }
LAB_002b63e7:
  operator_delete((void *)local_78._0_8_);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateLengthDelim(Formatter& format,
                                                 const FieldDescriptor* field) {
  if (field->is_packable()) {
    if (field->type() == FieldDescriptor::TYPE_ENUM &&
        !HasPreservingUnknownEnumSemantics(field)) {
      std::string enum_type = QualifiedClassName(field->enum_type(), options_);
      format(
          "ptr = "
          "::$proto_ns$::internal::Packed$1$Parser<$unknown_fields_type$>("
          "$msg$_internal_mutable_$name$(), ptr, ctx, $2$_IsValid, "
          "&$msg$_internal_metadata_, $3$);\n",
          DeclaredTypeMethodName(field->type()), enum_type, field->number());
    } else {
      format(
          "ptr = ::$proto_ns$::internal::Packed$1$Parser("
          "$msg$_internal_mutable_$name$(), ptr, ctx);\n",
          DeclaredTypeMethodName(field->type()));
    }
  } else {
    auto field_type = field->type();
    switch (field_type) {
      case FieldDescriptor::TYPE_STRING:
        GenerateStrings(format, field, true /* utf8 */);
        break;
      case FieldDescriptor::TYPE_BYTES:
        GenerateStrings(format, field, false /* utf8 */);
        break;
      case FieldDescriptor::TYPE_MESSAGE: {
        if (field->is_map()) {
          const FieldDescriptor* val =
              field->message_type()->FindFieldByName("value");
          GOOGLE_CHECK(val);
          if (val->type() == FieldDescriptor::TYPE_ENUM &&
              !HasPreservingUnknownEnumSemantics(field)) {
            format(
                "auto object = "
                "::$proto_ns$::internal::InitEnumParseWrapper<"
                "$unknown_fields_type$>(&$msg$$name$_, $1$_IsValid, "
                "$2$, &$msg$_internal_metadata_);\n"
                "ptr = ctx->ParseMessage(&object, ptr);\n",
                QualifiedClassName(val->enum_type(), options_),
                field->number());
          } else {
            format("ptr = ctx->ParseMessage(&$msg$$name$_, ptr);\n");
          }
        } else if (IsLazy(field, options_, scc_analyzer_)) {
          if (field->real_containing_oneof()) {
            format(
                "if (!$msg$_internal_has_$name$()) {\n"
                "  $msg$clear_$1$();\n"
                "  $msg$$1$_.$name$_ = ::$proto_ns$::Arena::CreateMessage<\n"
                "      ::$proto_ns$::internal::LazyField>("
                "$msg$GetArenaForAllocation());\n"
                "  $msg$set_has_$name$();\n"
                "}\n"
                "auto* lazy_field = $msg$$1$_.$name$_;\n",
                field->containing_oneof()->name());
          } else if (HasHasbit(field)) {
            format(
                "_Internal::set_has_$name$(&$has_bits$);\n"
                "auto* lazy_field = &$msg$$name$_;\n");
          } else {
            format("auto* lazy_field = &$msg$$name$_;\n");
          }
          format(
              "::$proto_ns$::internal::LazyFieldParseHelper<\n"
              "  ::$proto_ns$::internal::LazyField> parse_helper(\n"
              "    $1$::default_instance(),\n"
              "    $msg$GetArenaForAllocation(), lazy_field);\n"
              "ptr = ctx->ParseMessage(&parse_helper, ptr);\n",
              FieldMessageTypeName(field, options_));
        } else if (IsImplicitWeakField(field, options_, scc_analyzer_)) {
          if (!field->is_repeated()) {
            format(
                "ptr = ctx->ParseMessage(_Internal::mutable_$name$($this$), "
                "ptr);\n");
          } else {
            format(
                "ptr = ctx->ParseMessage($msg$$name$_.AddWeak("
                "reinterpret_cast<const ::$proto_ns$::MessageLite*>($1$ptr_)"
                "), ptr);\n",
                QualifiedDefaultInstanceName(field->message_type(), options_));
          }
        } else if (IsWeak(field, options_)) {
          format(
              "{\n"
              "  auto* default_ = &reinterpret_cast<const Message&>($1$);\n"
              "  ptr = ctx->ParseMessage($msg$_weak_field_map_.MutableMessage("
              "$2$, default_), ptr);\n"
              "}\n",
              QualifiedDefaultInstanceName(field->message_type(), options_),
              field->number());
        } else {
          format(
              "ptr = ctx->ParseMessage($msg$_internal_$mutable_field$(), "
              "ptr);\n");
        }
        break;
      }
      default:
        GOOGLE_LOG(FATAL) << "Illegal combination for length delimited wiretype "
                   << " filed type is " << field->type();
    }
  }
}